

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateUtils.cpp
# Opt level: O2

tm * ApprovalTests::DateUtils::createTm
               (tm *__return_storage_ptr__,int year,int month,int day,int hour,int minute,int second
               )

{
  __return_storage_ptr__->tm_gmtoff = 0;
  __return_storage_ptr__->tm_zone = (char *)0x0;
  __return_storage_ptr__->tm_wday = 0;
  __return_storage_ptr__->tm_yday = 0;
  *(undefined8 *)&__return_storage_ptr__->tm_isdst = 0;
  __return_storage_ptr__->tm_year = year + -0x76c;
  __return_storage_ptr__->tm_mon = month + -1;
  __return_storage_ptr__->tm_mday = day;
  __return_storage_ptr__->tm_hour = hour;
  __return_storage_ptr__->tm_min = minute;
  __return_storage_ptr__->tm_sec = second;
  return __return_storage_ptr__;
}

Assistant:

std::tm
    DateUtils::createTm(int year, int month, int day, int hour, int minute, int second)
    {
        std::tm timeinfo = tm();
        timeinfo.tm_year = year - 1900;
        timeinfo.tm_mon = month - 1;
        timeinfo.tm_mday = day;
        timeinfo.tm_hour = hour;
        timeinfo.tm_min = minute;
        timeinfo.tm_sec = second;
        return timeinfo;
    }